

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderTextureSizeTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureSizeCase::init
          (TextureSizeCase *this,EVP_PKEY_CTX *ctx)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  GLenum GVar4;
  GLenum GVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  ContextInfo *this_00;
  NotSupportedError *pNVar7;
  RenderTarget *pRVar8;
  ShaderProgram *this_01;
  ProgramSources *pPVar9;
  TestLog *pTVar10;
  TestError *this_02;
  MessageBuilder *pMVar11;
  TextureSizeCase *pTVar12;
  ShaderProgram *code;
  int local_43c;
  int local_438;
  int local_434;
  int local_428;
  int local_424;
  Vector<int,_3> local_384;
  int local_378;
  int local_374;
  int d;
  int h_1;
  int w_1;
  int ndx_1;
  int local_35c;
  int local_358;
  int h;
  int w;
  int ndx;
  undefined1 local_1ca;
  allocator<char> local_1c9;
  string local_1c8;
  undefined1 local_1a1;
  string local_1a0;
  ShaderSource local_180;
  string local_158;
  ShaderSource local_138;
  ProgramSources local_110;
  int local_40;
  int local_3c;
  GLint maxSamples;
  GLint maxTextureLayers;
  GLint maxTextureSize;
  undefined1 local_29;
  long lStack_28;
  bool supportsES32;
  Functions *gl;
  TextureSizeCase *local_10;
  TextureSizeCase *this_local;
  
  local_10 = this;
  if ((Functional::(anonymous_namespace)::TextureSizeCase::init()::testSizes2D == '\0') &&
     (iVar3 = __cxa_guard_acquire(&Functional::(anonymous_namespace)::TextureSizeCase::init()::
                                   testSizes2D), iVar3 != 0)) {
    tcu::Vector<int,_2>::Vector(init::testSizes2D,1,1);
    tcu::Vector<int,_2>::Vector(init::testSizes2D + 1,1,4);
    tcu::Vector<int,_2>::Vector(init::testSizes2D + 2,4,8);
    tcu::Vector<int,_2>::Vector(init::testSizes2D + 3,0x15,0xb);
    tcu::Vector<int,_2>::Vector(init::testSizes2D + 4,0x6b,0xfe);
    tcu::Vector<int,_2>::Vector(init::testSizes2D + 5,-1,3);
    tcu::Vector<int,_2>::Vector(init::testSizes2D + 6,3,-1);
    __cxa_guard_release(&Functional::(anonymous_namespace)::TextureSizeCase::init()::testSizes2D);
  }
  if ((Functional::(anonymous_namespace)::TextureSizeCase::init()::testSizes3D == '\0') &&
     (iVar3 = __cxa_guard_acquire(&Functional::(anonymous_namespace)::TextureSizeCase::init()::
                                   testSizes3D), iVar3 != 0)) {
    tcu::Vector<int,_3>::Vector(init::testSizes3D,1,1,1);
    tcu::Vector<int,_3>::Vector(init::testSizes3D + 1,1,4,7);
    tcu::Vector<int,_3>::Vector(init::testSizes3D + 2,4,8,0xc);
    tcu::Vector<int,_3>::Vector(init::testSizes3D + 3,0x15,0xb,9);
    tcu::Vector<int,_3>::Vector(init::testSizes3D + 4,0x6b,0xfe,2);
    tcu::Vector<int,_3>::Vector(init::testSizes3D + 5,-1,3,3);
    tcu::Vector<int,_3>::Vector(init::testSizes3D + 6,3,-1,3);
    tcu::Vector<int,_3>::Vector(init::testSizes3D + 7,4,4,-1);
    __cxa_guard_release(&Functional::(anonymous_namespace)::TextureSizeCase::init()::testSizes3D);
  }
  if ((Functional::(anonymous_namespace)::TextureSizeCase::init()::fullscreenQuad == '\0') &&
     (iVar3 = __cxa_guard_acquire(&Functional::(anonymous_namespace)::TextureSizeCase::init()::
                                   fullscreenQuad), iVar3 != 0)) {
    tcu::Vector<float,_4>::Vector(init::fullscreenQuad,-1.0,1.0,0.0,1.0);
    tcu::Vector<float,_4>::Vector(init::fullscreenQuad + 1,-1.0,-1.0,0.0,1.0);
    tcu::Vector<float,_4>::Vector(init::fullscreenQuad + 2,1.0,1.0,0.0,1.0);
    tcu::Vector<float,_4>::Vector(init::fullscreenQuad + 3,1.0,-1.0,0.0,1.0);
    __cxa_guard_release(&Functional::(anonymous_namespace)::TextureSizeCase::init()::fullscreenQuad)
    ;
  }
  pRVar6 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar6->_vptr_RenderContext[3])();
  lStack_28 = CONCAT44(extraout_var,iVar3);
  pRVar6 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  maxTextureSize = (*pRVar6->_vptr_RenderContext[2])();
  maxTextureLayers = (GLint)glu::ApiType::es(3,2);
  local_29 = glu::contextSupports((ContextType)maxTextureSize,(ApiType)maxTextureLayers);
  if (((this->m_isArrayType & 1U) != 0) && (!(bool)local_29)) {
    this_00 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
    bVar2 = glu::ContextInfo::isExtensionSupported
                      (this_00,"GL_OES_texture_storage_multisample_2d_array");
    if (!bVar2) {
      pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar7,"Test requires OES_texture_storage_multisample_2d_array extension",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
                 ,0xa7);
      __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  pRVar8 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar3 = tcu::RenderTarget::getWidth(pRVar8);
  if (0 < iVar3) {
    pRVar8 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
    iVar3 = tcu::RenderTarget::getHeight(pRVar8);
    if (0 < iVar3) {
      maxSamples = 0;
      local_3c = 0;
      local_40 = 0;
      (**(code **)(lStack_28 + 0x868))(0xd33,&maxSamples);
      (**(code **)(lStack_28 + 0x868))(0x88ff,&local_3c);
      pcVar1 = *(code **)(lStack_28 + 0x880);
      GVar4 = getTextureGLTarget(this);
      GVar5 = getTextureGLInternalFormat(this);
      (*pcVar1)(GVar4,GVar5,0x80a9,1,&local_40);
      if (local_40 < this->m_numSamples) {
        pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (pNVar7,"sample count is not supported",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
                   ,0xb5);
        __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
      this_01 = (ShaderProgram *)operator_new(0xd0);
      local_1a1 = 1;
      code = this_01;
      pRVar6 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
      glu::ProgramSources::ProgramSources(&local_110);
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_158,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
                 (Context *)
                 "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
                 ,(char *)code);
      glu::VertexSource::VertexSource((VertexSource *)&local_138,&local_158);
      pPVar9 = glu::ProgramSources::operator<<(&local_110,&local_138);
      Functional::(anonymous_namespace)::TextureSizeCase::genFragmentSource_abi_cxx11_
                (&local_1a0,this);
      glu::FragmentSource::FragmentSource((FragmentSource *)&local_180,&local_1a0);
      pPVar9 = glu::ProgramSources::operator<<(pPVar9,&local_180);
      glu::ShaderProgram::ShaderProgram(this_01,pRVar6,pPVar9);
      local_1a1 = 0;
      this->m_shader = this_01;
      glu::FragmentSource::~FragmentSource((FragmentSource *)&local_180);
      std::__cxx11::string::~string((string *)&local_1a0);
      glu::VertexSource::~VertexSource((VertexSource *)&local_138);
      std::__cxx11::string::~string((string *)&local_158);
      glu::ProgramSources::~ProgramSources(&local_110);
      pTVar10 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      glu::operator<<(pTVar10,this->m_shader);
      bVar2 = glu::ShaderProgram::isOk(this->m_shader);
      if (bVar2) {
        (**(code **)(lStack_28 + 0x6c8))(1,&this->m_vbo);
        (**(code **)(lStack_28 + 0x40))(0x8892,this->m_vbo);
        (**(code **)(lStack_28 + 0x150))(0x8892,0x40,init::fullscreenQuad,0x88e4);
        pTVar10 = tcu::TestContext::getLog
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)&w,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar11 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)&w,(char (*) [23])"GL_MAX_TEXTURE_SIZE = ");
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&maxSamples);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x2b9e07b);
        pMVar11 = tcu::MessageBuilder::operator<<
                            (pMVar11,(char (*) [31])"GL_MAX_ARRAY_TEXTURE_LAYERS = ");
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_3c);
        tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&w);
        if ((this->m_isArrayType & 1U) == 0) {
          h = 0;
          pTVar12 = this;
          while (iVar3 = (int)pTVar12, h < 7) {
            iVar3 = tcu::Vector<int,_2>::x(init::testSizes2D + h);
            if ((iVar3 <= maxSamples) &&
               (iVar3 = tcu::Vector<int,_2>::y(init::testSizes2D + h), iVar3 <= maxSamples)) {
              iVar3 = tcu::Vector<int,_2>::x(init::testSizes2D + h);
              if (iVar3 < 0) {
                local_424 = maxSamples;
              }
              else {
                local_424 = tcu::Vector<int,_2>::x(init::testSizes2D + h);
              }
              local_358 = local_424;
              iVar3 = tcu::Vector<int,_2>::y(init::testSizes2D + h);
              if (iVar3 < 0) {
                local_428 = maxSamples;
              }
              else {
                local_428 = tcu::Vector<int,_2>::y(init::testSizes2D + h);
              }
              local_35c = local_428;
              tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&w_1,local_358,local_428,0);
              std::vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>::push_back
                        (&this->m_iterations,(value_type *)&w_1);
            }
            h = h + 1;
            pTVar12 = (TextureSizeCase *)(ulong)(uint)h;
          }
        }
        else {
          h_1 = 0;
          pTVar12 = this;
          while (iVar3 = (int)pTVar12, h_1 < 8) {
            iVar3 = tcu::Vector<int,_3>::x(init::testSizes3D + h_1);
            if (((iVar3 <= maxSamples) &&
                (iVar3 = tcu::Vector<int,_3>::y(init::testSizes3D + h_1), iVar3 <= maxSamples)) &&
               (iVar3 = tcu::Vector<int,_3>::z(init::testSizes3D + h_1), iVar3 <= local_3c)) {
              iVar3 = tcu::Vector<int,_3>::x(init::testSizes3D + h_1);
              if (iVar3 < 0) {
                local_434 = maxSamples;
              }
              else {
                local_434 = tcu::Vector<int,_3>::x(init::testSizes3D + h_1);
              }
              d = local_434;
              iVar3 = tcu::Vector<int,_3>::y(init::testSizes3D + h_1);
              if (iVar3 < 0) {
                local_438 = maxSamples;
              }
              else {
                local_438 = tcu::Vector<int,_3>::y(init::testSizes3D + h_1);
              }
              local_374 = local_438;
              iVar3 = tcu::Vector<int,_3>::z(init::testSizes3D + h_1);
              if (iVar3 < 0) {
                local_43c = local_3c;
              }
              else {
                local_43c = tcu::Vector<int,_3>::z(init::testSizes3D + h_1);
              }
              local_378 = local_43c;
              tcu::Vector<int,_3>::Vector(&local_384,d,local_374,local_43c);
              std::vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>::push_back
                        (&this->m_iterations,&local_384);
            }
            h_1 = h_1 + 1;
            pTVar12 = (TextureSizeCase *)(ulong)(uint)h_1;
          }
        }
        return iVar3;
      }
      local_1ca = 1;
      this_02 = (TestError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,"shader build failed",&local_1c9);
      tcu::TestError::TestError(this_02,&local_1c8);
      local_1ca = 0;
      __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (pNVar7,"rendertarget size must be at least 1x1",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
             ,0xaa);
  __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void TextureSizeCase::init (void)
{
	static const tcu::IVec2 testSizes2D[] =
	{
		tcu::IVec2(1,	1),
		tcu::IVec2(1,	4),
		tcu::IVec2(4,	8),
		tcu::IVec2(21,	11),
		tcu::IVec2(107,	254),
		tcu::IVec2(-1,	3),
		tcu::IVec2(3,	-1),
	};
	static const tcu::IVec3 testSizes3D[] =
	{
		tcu::IVec3(1,	1,		1),
		tcu::IVec3(1,	4,		7),
		tcu::IVec3(4,	8,		12),
		tcu::IVec3(21,	11,		9),
		tcu::IVec3(107,	254,	2),
		tcu::IVec3(-1,	3,		3),
		tcu::IVec3(3,	-1,		3),
		tcu::IVec3(4,	4,		-1),
	};
	static const tcu::Vec4 fullscreenQuad[] =
	{
		tcu::Vec4(-1.0f,  1.0f, 0.0f, 1.0f),
		tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f),
		tcu::Vec4( 1.0f,  1.0f, 0.0f, 1.0f),
		tcu::Vec4( 1.0f, -1.0f, 0.0f, 1.0f)
	};

	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const bool				supportsES32		= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	// requirements
	if (m_isArrayType && !supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array"))
		TCU_THROW(NotSupportedError, "Test requires OES_texture_storage_multisample_2d_array extension");

	if (m_context.getRenderTarget().getWidth() < 1 || m_context.getRenderTarget().getHeight() < 1)
		TCU_THROW(NotSupportedError, "rendertarget size must be at least 1x1");

	glw::GLint				maxTextureSize		= 0;
	glw::GLint				maxTextureLayers	= 0;
	glw::GLint				maxSamples			= 0;

	gl.getIntegerv(GL_MAX_TEXTURE_SIZE, &maxTextureSize);
	gl.getIntegerv(GL_MAX_ARRAY_TEXTURE_LAYERS, &maxTextureLayers);
	gl.getInternalformativ(getTextureGLTarget(), getTextureGLInternalFormat(), GL_SAMPLES, 1, &maxSamples);

	if (m_numSamples > maxSamples)
		TCU_THROW(NotSupportedError, "sample count is not supported");

	// gen shade

	m_shader = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(specializeShader(m_context, s_positionVertexShaderSource)) << glu::FragmentSource(genFragmentSource()));
	m_testCtx.getLog() << *m_shader;
	if (!m_shader->isOk())
		throw tcu::TestError("shader build failed");

	// gen buffer

	gl.genBuffers(1, &m_vbo);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_vbo);
	gl.bufferData(GL_ARRAY_BUFFER, sizeof(fullscreenQuad), fullscreenQuad, GL_STATIC_DRAW);

	// gen iterations

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "GL_MAX_TEXTURE_SIZE = " << maxTextureSize << "\n"
		<< "GL_MAX_ARRAY_TEXTURE_LAYERS = " << maxTextureLayers
		<< tcu::TestLog::EndMessage;

	if (!m_isArrayType)
	{
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(testSizes2D); ++ndx)
		{
			if (testSizes2D[ndx].x() <= maxTextureSize && testSizes2D[ndx].y() <= maxTextureSize)
			{
				const int w = (testSizes2D[ndx].x() < 0) ? (maxTextureSize) : (testSizes2D[ndx].x());
				const int h = (testSizes2D[ndx].y() < 0) ? (maxTextureSize) : (testSizes2D[ndx].y());

				m_iterations.push_back(tcu::IVec3(w, h, 0));
			}
		}
	}
	else
	{
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(testSizes3D); ++ndx)
		{
			if (testSizes3D[ndx].x() <= maxTextureSize && testSizes3D[ndx].y() <= maxTextureSize && testSizes3D[ndx].z() <= maxTextureLayers)
			{
				const int w = (testSizes3D[ndx].x() < 0) ? (maxTextureSize)		: (testSizes3D[ndx].x());
				const int h = (testSizes3D[ndx].y() < 0) ? (maxTextureSize)		: (testSizes3D[ndx].y());
				const int d = (testSizes3D[ndx].z() < 0) ? (maxTextureLayers)	: (testSizes3D[ndx].z());

				m_iterations.push_back(tcu::IVec3(w, h, d));
			}
		}
	}
}